

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::Image::readLinear
          (Image *this,VkOffset3D offset,int width,int height,int depth,uint mipLevel,
          uint arrayElement,VkImageAspectFlagBits aspect,void *data)

{
  Allocation *pAVar1;
  void *pvVar2;
  VkDeviceSize VVar3;
  int pixelSize;
  VkDeviceSize VVar4;
  undefined8 extraout_RDX;
  VkOffset3D offset_00;
  VkImageSubresource imageSubResource;
  Allocation local_78;
  VkSubresourceLayout imageLayout;
  
  offset_00._0_8_ = offset._0_8_;
  imageSubResource.aspectMask = aspect;
  imageSubResource.mipLevel = mipLevel;
  imageSubResource.arrayLayer = arrayElement;
  imageLayout.rowPitch = 0;
  imageLayout.arrayPitch = 0;
  imageLayout.offset = 0;
  imageLayout.size = 0;
  imageLayout.depthPitch = 0;
  (*this->m_vk->_vptr_DeviceInterface[0x27])
            (this->m_vk,this->m_device,
             (this->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
             ,&imageSubResource,&imageLayout);
  pAVar1 = (this->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_78._vptr_Allocation = (_func_int **)&PTR__Allocation_00d1abf8;
  pvVar2 = pAVar1->m_hostPtr;
  local_78.m_memory.m_internal = (pAVar1->m_memory).m_internal;
  local_78.m_offset = pAVar1->m_offset;
  local_78.m_hostPtr = pvVar2;
  ::vk::Allocation::~Allocation(&local_78);
  VVar3 = imageLayout.offset;
  offset_00.z = (deInt32)extraout_RDX;
  VVar4 = getPixelOffset(this,offset_00,imageLayout.rowPitch,imageLayout.depthPitch,mipLevel,
                         arrayElement);
  local_78._vptr_Allocation = (_func_int **)::vk::mapVkFormat(this->m_format);
  pixelSize = tcu::TextureFormat::getPixelSize((TextureFormat *)&local_78);
  MemoryOp::unpack(pixelSize,width,height,depth,imageLayout.rowPitch,imageLayout.depthPitch,
                   (void *)((long)pvVar2 + VVar4 + VVar3),data);
  return;
}

Assistant:

void Image::readLinear (vk::VkOffset3D				offset,
						int							width,
						int							height,
						int							depth,
						unsigned int				mipLevel,
						unsigned int				arrayElement,
						vk::VkImageAspectFlagBits	aspect,
						void *						data)
{
	vk::VkImageSubresource imageSubResource = { (vk::VkImageAspectFlags)aspect, mipLevel, arrayElement };

	vk::VkSubresourceLayout imageLayout;
	deMemset(&imageLayout, 0, sizeof(imageLayout));

	m_vk.getImageSubresourceLayout(m_device, object(), &imageSubResource, &imageLayout);

	const deUint8* srcPtr = reinterpret_cast<const deUint8*>(getBoundMemory().getHostPtr());
	srcPtr += imageLayout.offset + getPixelOffset(offset, imageLayout.rowPitch, imageLayout.depthPitch, mipLevel, arrayElement);

	MemoryOp::unpack(vk::mapVkFormat(m_format).getPixelSize(), width, height, depth,
		imageLayout.rowPitch, imageLayout.depthPitch, srcPtr, data);
}